

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

bool __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
::
modify_if<int,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_ModifyIf_Test::TestBody()::__0&>
          (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
           *this,key_arg<int> *key,anon_class_1_0_00000001 *f)

{
  undefined1 auVar1 [16];
  pointer ppVar2;
  DoNothing m;
  DoNothing local_1;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*key;
  ppVar2 = find_ptr<int,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
                     (this,key,SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
                               SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),&local_1);
  if (ppVar2 != (pointer)0x0) {
    ppVar2->second = 0xb;
  }
  return ppVar2 != (pointer)0x0;
}

Assistant:

bool modify_if(const key_arg<K>& key, F&& f) {
        return modify_if_impl<K, F, UniqueLock>(key, std::forward<F>(f));
    }